

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTextureFormatTests.cpp
# Opt level: O3

IterateResult __thiscall
deqp::gles3::Functional::Texture2DArrayFormatCase::iterate(Texture2DArrayFormatCase *this)

{
  TestContext *this_00;
  bool bVar1;
  int iVar2;
  
  bVar1 = testLayer(this,this->m_curLayer);
  if ((!bVar1) &&
     (this_00 = (this->super_TestCase).super_TestNode.m_testCtx,
     this_00->m_testResult == QP_TEST_RESULT_PASS)) {
    tcu::TestContext::setTestResult(this_00,QP_TEST_RESULT_FAIL,"Image comparison failed");
  }
  iVar2 = this->m_curLayer + 1;
  this->m_curLayer = iVar2;
  return (IterateResult)(iVar2 < (this->m_texture->m_refTexture).m_numLayers);
}

Assistant:

Texture2DArrayFormatCase::IterateResult Texture2DArrayFormatCase::iterate (void)
{
	// Execute test for all layers.
	bool isOk = testLayer(m_curLayer);

	if (!isOk && m_testCtx.getTestResult() == QP_TEST_RESULT_PASS)
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Image comparison failed");

	m_curLayer += 1;

	return m_curLayer < m_texture->getRefTexture().getNumLayers() ? CONTINUE : STOP;
}